

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::MergeFrom
          (GeneratedCodeInfo_Annotation *this,Message *from)

{
  LogMessage *other;
  GeneratedCodeInfo_Annotation *from_00;
  GeneratedCodeInfo_Annotation *source;
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *from_local;
  GeneratedCodeInfo_Annotation *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = &this->super_Message;
  if ((GeneratedCodeInfo_Annotation *)from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3d19);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&source + 3),other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = internal::DynamicCastToGenerated<google::protobuf::GeneratedCodeInfo_Annotation_const>
                      (local_18);
  if (from_00 == (GeneratedCodeInfo_Annotation *)0x0) {
    internal::ReflectionOps::Merge(local_18,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.GeneratedCodeInfo.Annotation)
  GOOGLE_DCHECK_NE(&from, this);
  const GeneratedCodeInfo_Annotation* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const GeneratedCodeInfo_Annotation>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.GeneratedCodeInfo.Annotation)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.GeneratedCodeInfo.Annotation)
    MergeFrom(*source);
  }
}